

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallGetRuntimeDependenciesGenerator.cxx
# Opt level: O0

void __thiscall
cmInstallGetRuntimeDependenciesGenerator::GenerateScriptForConfig
          (cmInstallGetRuntimeDependenciesGenerator *this,ostream *os,string *config,Indent indent)

{
  bool bVar1;
  bool bVar2;
  cmMakefile *this_00;
  string *psVar3;
  ostream *poVar4;
  vector<std::unique_ptr<cmInstallRuntimeDependencySet::Item,_std::default_delete<cmInstallRuntimeDependencySet::Item>_>,_std::allocator<std::unique_ptr<cmInstallRuntimeDependencySet::Item,_std::default_delete<cmInstallRuntimeDependencySet::Item>_>_>_>
  *pvVar5;
  Item *pIVar6;
  reference pbVar7;
  ulong uVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *file;
  iterator __end1;
  iterator __begin1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  undefined1 local_1f8 [7];
  bool first;
  anon_class_48_3_25f25bd9 addPostExclude;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  postExcludeFiles;
  string_view local_190;
  int local_17c;
  string_view local_178;
  int local_164;
  string_view local_160;
  int local_14c;
  string_view local_148;
  int local_134;
  string_view local_130;
  int local_11c;
  string_view local_118;
  int local_104;
  string_view local_100;
  string local_f0 [32];
  int local_d0;
  int local_cc;
  string_view local_c8;
  int local_b4;
  string_view local_b0;
  int local_9c;
  string_view local_98;
  int local_84;
  int local_80;
  allocator<char> local_69;
  string local_68;
  string local_48 [8];
  string installNameTool;
  string *config_local;
  ostream *os_local;
  cmInstallGetRuntimeDependenciesGenerator *this_local;
  Indent indent_local;
  
  installNameTool.field_2._8_8_ = config;
  this_00 = cmLocalGenerator::GetMakefile(this->LocalGenerator);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"CMAKE_INSTALL_NAME_TOOL",&local_69);
  psVar3 = cmMakefile::GetSafeDefinition(this_00,&local_68);
  std::__cxx11::string::string(local_48,(string *)psVar3);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  local_80 = indent.Level;
  poVar4 = ::operator<<(os,(cmScriptGeneratorIndent)indent.Level);
  poVar4 = std::operator<<(poVar4,"file(GET_RUNTIME_DEPENDENCIES\n");
  local_84 = indent.Level;
  poVar4 = ::operator<<(poVar4,(cmScriptGeneratorIndent)indent.Level);
  poVar4 = std::operator<<(poVar4,"  RESOLVED_DEPENDENCIES_VAR ");
  poVar4 = std::operator<<(poVar4,this->DepsVar);
  std::operator<<(poVar4,'\n');
  local_98 = (string_view)::cm::operator____s("EXECUTABLES",0xb);
  pvVar5 = cmInstallRuntimeDependencySet::GetExecutables(this->RuntimeDependencySet);
  local_9c = indent.Level;
  anon_unknown.dwarf_f55b27::WriteFilesArgument
            (os,&local_98,pvVar5,(string *)installNameTool.field_2._8_8_,
             (cmScriptGeneratorIndent)indent.Level);
  local_b0 = (string_view)::cm::operator____s("LIBRARIES",9);
  pvVar5 = cmInstallRuntimeDependencySet::GetLibraries(this->RuntimeDependencySet);
  local_b4 = indent.Level;
  anon_unknown.dwarf_f55b27::WriteFilesArgument
            (os,&local_b0,pvVar5,(string *)installNameTool.field_2._8_8_,
             (cmScriptGeneratorIndent)indent.Level);
  local_c8 = (string_view)::cm::operator____s("MODULES",7);
  pvVar5 = cmInstallRuntimeDependencySet::GetModules(this->RuntimeDependencySet);
  local_cc = indent.Level;
  anon_unknown.dwarf_f55b27::WriteFilesArgument
            (os,&local_c8,pvVar5,(string *)installNameTool.field_2._8_8_,
             (cmScriptGeneratorIndent)indent.Level);
  pIVar6 = cmInstallRuntimeDependencySet::GetBundleExecutable(this->RuntimeDependencySet);
  if (pIVar6 != (Item *)0x0) {
    local_d0 = indent.Level;
    poVar4 = ::operator<<(os,(cmScriptGeneratorIndent)indent.Level);
    poVar4 = std::operator<<(poVar4,"  BUNDLE_EXECUTABLE \"");
    pIVar6 = cmInstallRuntimeDependencySet::GetBundleExecutable(this->RuntimeDependencySet);
    (*pIVar6->_vptr_Item[2])(local_f0,pIVar6,installNameTool.field_2._8_8_);
    poVar4 = std::operator<<(poVar4,local_f0);
    std::operator<<(poVar4,"\"\n");
    std::__cxx11::string::~string(local_f0);
  }
  local_100 = (string_view)::cm::operator____s("DIRECTORIES",0xb);
  local_104 = indent.Level;
  anon_unknown.dwarf_f55b27::WriteGenexEvaluatorArgument
            (os,&local_100,&this->Directories,(string *)installNameTool.field_2._8_8_,
             this->LocalGenerator,(cmScriptGeneratorIndent)indent.Level);
  local_118 = (string_view)::cm::operator____s("PRE_INCLUDE_REGEXES",0x13);
  local_11c = indent.Level;
  anon_unknown.dwarf_f55b27::WriteGenexEvaluatorArgument
            (os,&local_118,&this->PreIncludeRegexes,(string *)installNameTool.field_2._8_8_,
             this->LocalGenerator,(cmScriptGeneratorIndent)indent.Level);
  local_130 = (string_view)::cm::operator____s("PRE_EXCLUDE_REGEXES",0x13);
  local_134 = indent.Level;
  anon_unknown.dwarf_f55b27::WriteGenexEvaluatorArgument
            (os,&local_130,&this->PreExcludeRegexes,(string *)installNameTool.field_2._8_8_,
             this->LocalGenerator,(cmScriptGeneratorIndent)indent.Level);
  local_148 = (string_view)::cm::operator____s("POST_INCLUDE_REGEXES",0x14);
  local_14c = indent.Level;
  anon_unknown.dwarf_f55b27::WriteGenexEvaluatorArgument
            (os,&local_148,&this->PostIncludeRegexes,(string *)installNameTool.field_2._8_8_,
             this->LocalGenerator,(cmScriptGeneratorIndent)indent.Level);
  local_160 = (string_view)::cm::operator____s("POST_EXCLUDE_REGEXES",0x14);
  local_164 = indent.Level;
  anon_unknown.dwarf_f55b27::WriteGenexEvaluatorArgument
            (os,&local_160,&this->PostExcludeRegexes,(string *)installNameTool.field_2._8_8_,
             this->LocalGenerator,(cmScriptGeneratorIndent)indent.Level);
  local_178 = (string_view)::cm::operator____s("POST_INCLUDE_FILES",0x12);
  local_17c = indent.Level;
  anon_unknown.dwarf_f55b27::WriteGenexEvaluatorArgument
            (os,&local_178,&this->PostIncludeFiles,(string *)installNameTool.field_2._8_8_,
             this->LocalGenerator,(cmScriptGeneratorIndent)indent.Level);
  local_190 = (string_view)::cm::operator____s("POST_EXCLUDE_FILES",0x12);
  anon_unknown.dwarf_f55b27::WriteGenexEvaluatorArgument
            (os,&local_190,&this->PostExcludeFiles,(string *)installNameTool.field_2._8_8_,
             this->LocalGenerator,(cmScriptGeneratorIndent)indent.Level);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)&addPostExclude.this);
  std::__cxx11::string::string((string *)local_1f8,(string *)installNameTool.field_2._8_8_);
  addPostExclude.config.field_2._8_8_ = &addPostExclude.this;
  addPostExclude.postExcludeFiles =
       (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)this;
  pvVar5 = cmInstallRuntimeDependencySet::GetExecutables(this->RuntimeDependencySet);
  GenerateScriptForConfig::anon_class_48_3_25f25bd9::operator()
            ((anon_class_48_3_25f25bd9 *)local_1f8,pvVar5);
  pvVar5 = cmInstallRuntimeDependencySet::GetLibraries(this->RuntimeDependencySet);
  GenerateScriptForConfig::anon_class_48_3_25f25bd9::operator()
            ((anon_class_48_3_25f25bd9 *)local_1f8,pvVar5);
  pvVar5 = cmInstallRuntimeDependencySet::GetModules(this->RuntimeDependencySet);
  GenerateScriptForConfig::anon_class_48_3_25f25bd9::operator()
            ((anon_class_48_3_25f25bd9 *)local_1f8,pvVar5);
  bVar1 = true;
  __end1 = std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&addPostExclude.this);
  file = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&addPostExclude.this);
  while( true ) {
    bVar2 = std::operator!=(&__end1,(_Self *)&file);
    if (!bVar2) break;
    pbVar7 = std::
             _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&__end1);
    if (bVar1) {
      poVar4 = ::operator<<(os,(cmScriptGeneratorIndent)indent.Level);
      std::operator<<(poVar4,"  POST_EXCLUDE_FILES_STRICT\n");
      bVar1 = false;
    }
    poVar4 = ::operator<<(os,(cmScriptGeneratorIndent)indent.Level);
    poVar4 = std::operator<<(poVar4,"    \"");
    poVar4 = std::operator<<(poVar4,(string *)pbVar7);
    std::operator<<(poVar4,"\"\n");
    std::
    _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end1);
  }
  uVar8 = std::__cxx11::string::empty();
  if (((uVar8 & 1) == 0) && ((this->NoInstallRPath & 1U) == 0)) {
    poVar4 = ::operator<<(os,(cmScriptGeneratorIndent)indent.Level);
    poVar4 = std::operator<<(poVar4,"  RPATH_PREFIX ");
    poVar4 = std::operator<<(poVar4,this->RPathPrefix);
    std::operator<<(poVar4,'\n');
  }
  poVar4 = ::operator<<(os,(cmScriptGeneratorIndent)indent.Level);
  std::operator<<(poVar4,"  )\n");
  GenerateScriptForConfig(std::ostream&,std::__cxx11::string_const&,cmScriptGeneratorIndent)::$_0::
  ~__0((__0 *)local_1f8);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)&addPostExclude.this);
  std::__cxx11::string::~string(local_48);
  return;
}

Assistant:

void cmInstallGetRuntimeDependenciesGenerator::GenerateScriptForConfig(
  std::ostream& os, const std::string& config, Indent indent)
{
  std::string installNameTool =
    this->LocalGenerator->GetMakefile()->GetSafeDefinition(
      "CMAKE_INSTALL_NAME_TOOL");

  os << indent << "file(GET_RUNTIME_DEPENDENCIES\n"
     << indent << "  RESOLVED_DEPENDENCIES_VAR " << this->DepsVar << '\n';
  WriteFilesArgument(os, "EXECUTABLES"_s,
                     this->RuntimeDependencySet->GetExecutables(), config,
                     indent);
  WriteFilesArgument(os, "LIBRARIES"_s,
                     this->RuntimeDependencySet->GetLibraries(), config,
                     indent);
  WriteFilesArgument(os, "MODULES"_s, this->RuntimeDependencySet->GetModules(),
                     config, indent);
  if (this->RuntimeDependencySet->GetBundleExecutable()) {
    os << indent << "  BUNDLE_EXECUTABLE \""
       << this->RuntimeDependencySet->GetBundleExecutable()->GetItemPath(
            config)
       << "\"\n";
  }
  WriteGenexEvaluatorArgument(os, "DIRECTORIES"_s, this->Directories, config,
                              this->LocalGenerator, indent);
  WriteGenexEvaluatorArgument(os, "PRE_INCLUDE_REGEXES"_s,
                              this->PreIncludeRegexes, config,
                              this->LocalGenerator, indent);
  WriteGenexEvaluatorArgument(os, "PRE_EXCLUDE_REGEXES"_s,
                              this->PreExcludeRegexes, config,
                              this->LocalGenerator, indent);
  WriteGenexEvaluatorArgument(os, "POST_INCLUDE_REGEXES"_s,
                              this->PostIncludeRegexes, config,
                              this->LocalGenerator, indent);
  WriteGenexEvaluatorArgument(os, "POST_EXCLUDE_REGEXES"_s,
                              this->PostExcludeRegexes, config,
                              this->LocalGenerator, indent);
  WriteGenexEvaluatorArgument(os, "POST_INCLUDE_FILES"_s,
                              this->PostIncludeFiles, config,
                              this->LocalGenerator, indent);
  WriteGenexEvaluatorArgument(os, "POST_EXCLUDE_FILES"_s,
                              this->PostExcludeFiles, config,
                              this->LocalGenerator, indent);

  std::set<std::string> postExcludeFiles;
  auto const addPostExclude =
    [config, &postExcludeFiles, this](
      const std::vector<std::unique_ptr<cmInstallRuntimeDependencySet::Item>>&
        tgts) {
      for (auto const& item : tgts) {
        item->AddPostExcludeFiles(config, postExcludeFiles,
                                  this->RuntimeDependencySet);
      }
    };
  addPostExclude(this->RuntimeDependencySet->GetExecutables());
  addPostExclude(this->RuntimeDependencySet->GetLibraries());
  addPostExclude(this->RuntimeDependencySet->GetModules());
  bool first = true;
  for (auto const& file : postExcludeFiles) {
    if (first) {
      os << indent << "  POST_EXCLUDE_FILES_STRICT\n";
      first = false;
    }
    os << indent << "    \"" << file << "\"\n";
  }

  if (!installNameTool.empty() && !this->NoInstallRPath) {
    os << indent << "  RPATH_PREFIX " << this->RPathPrefix << '\n';
  }
  os << indent << "  )\n";
}